

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

void WI_Drawer(void)

{
  int iVar1;
  
  if (state == StatCount) {
    iVar1 = FIntCVar::operator_cast_to_int(&deathmatch);
    if (iVar1 == 0) {
      if ((multiplayer & 1U) == 0) {
        WI_drawStats();
      }
      else {
        WI_drawNetgameStats();
      }
    }
    else {
      WI_drawDeathmatchStats();
    }
  }
  else if (state == ShowNextLoc) {
    WI_drawShowNextLoc();
  }
  else if (state != LeavingIntermission) {
    WI_drawNoState();
  }
  return;
}

Assistant:

void WI_Drawer (void)
{
	switch (state)
	{
	case StatCount:
		if (deathmatch)
			WI_drawDeathmatchStats();
		else if (multiplayer)
			WI_drawNetgameStats();
		else
			WI_drawStats();
		break;
	
	case ShowNextLoc:
		WI_drawShowNextLoc();
		break;
	
	case LeavingIntermission:
		break;

	default:
		WI_drawNoState();
		break;
	}
}